

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O2

int chirc_ctx_add_channel(chirc_ctx_t *ctx,chirc_channel_t *channel)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  sds s;
  UT_hash_handle *pUVar3;
  UT_hash_handle *pUVar4;
  size_t sVar5;
  UT_hash_table *pUVar6;
  UT_hash_bucket *__ptr;
  UT_hash_bucket *pUVar7;
  byte *pbVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  UT_hash_handle *pUVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  
  s = channel->name;
  sVar5 = sdslen(s);
  pbVar8 = (byte *)(s + 10);
  uVar9 = 0xfeedbeef;
  uVar11 = 0x9e3779b9;
  uVar14 = 0x9e3779b9;
  uVar10 = sVar5 & 0xffffffff;
  while (uVar12 = (uint)uVar10, 0xb < uVar12) {
    uVar9 = uVar9 + *(int *)(pbVar8 + -2);
    uVar15 = uVar9 >> 0xd ^
             ((uVar14 + *(int *)(pbVar8 + -10)) - (uVar11 + *(int *)(pbVar8 + -6))) - uVar9;
    uVar14 = uVar15 << 8 ^ ((uVar11 + *(int *)(pbVar8 + -6)) - uVar9) - uVar15;
    uVar11 = uVar14 >> 0xd ^ (uVar9 - uVar15) - uVar14;
    uVar9 = uVar11 >> 0xc ^ (uVar15 - uVar14) - uVar11;
    uVar15 = uVar9 << 0x10 ^ (uVar14 - uVar11) - uVar9;
    uVar16 = uVar15 >> 5 ^ (uVar11 - uVar9) - uVar15;
    uVar14 = uVar16 >> 3 ^ (uVar9 - uVar15) - uVar16;
    uVar11 = uVar14 << 10 ^ (uVar15 - uVar16) - uVar14;
    uVar9 = uVar11 >> 0xf ^ (uVar16 - uVar14) - uVar11;
    pbVar8 = pbVar8 + 0xc;
    uVar10 = (ulong)(uVar12 - 0xc);
  }
  uVar9 = uVar9 + (int)sVar5;
  switch(uVar12) {
  case 0xb:
    uVar9 = (uint)*pbVar8 * 0x1000000 + uVar9;
  case 10:
    uVar9 = (uint)pbVar8[-1] * 0x10000 + uVar9;
  case 9:
    uVar9 = (uint)pbVar8[-2] * 0x100 + uVar9;
  case 8:
    uVar11 = (uint)pbVar8[-3] * 0x1000000 + uVar11;
  case 7:
    uVar11 = (uint)pbVar8[-4] * 0x10000 + uVar11;
  case 6:
    uVar11 = (uint)pbVar8[-5] * 0x100 + uVar11;
  case 5:
    uVar11 = pbVar8[-6] + uVar11;
  case 4:
    uVar14 = (uint)pbVar8[-7] * 0x1000000 + uVar14;
  case 3:
    uVar14 = (uint)pbVar8[-8] * 0x10000 + uVar14;
  case 2:
    uVar14 = (uint)pbVar8[-9] * 0x100 + uVar14;
  case 1:
    uVar14 = pbVar8[-10] + uVar14;
  }
  uVar14 = uVar9 >> 0xd ^ (uVar14 - uVar11) - uVar9;
  uVar11 = uVar14 << 8 ^ (uVar11 - uVar9) - uVar14;
  uVar12 = uVar11 >> 0xd ^ (uVar9 - uVar14) - uVar11;
  uVar14 = uVar12 >> 0xc ^ (uVar14 - uVar11) - uVar12;
  uVar9 = uVar14 << 0x10 ^ (uVar11 - uVar12) - uVar14;
  uVar11 = uVar9 >> 5 ^ (uVar12 - uVar14) - uVar9;
  uVar14 = uVar11 >> 3 ^ (uVar14 - uVar9) - uVar11;
  uVar9 = uVar14 << 10 ^ (uVar9 - uVar11) - uVar14;
  uVar9 = uVar9 >> 0xf ^ uVar11 - (uVar14 + uVar9);
  pUVar1 = &channel->hh;
  (channel->hh).hashv = uVar9;
  (channel->hh).key = s;
  sVar5 = sdslen(s);
  (channel->hh).keylen = (uint)sVar5;
  if (ctx->channels == (chirc_channel_t *)0x0) {
    pUVar6 = (UT_hash_table *)calloc(1,0x40);
    (channel->hh).prev = (void *)0x0;
    (channel->hh).next = (void *)0x0;
    (channel->hh).tbl = pUVar6;
    if (pUVar6 == (UT_hash_table *)0x0) goto LAB_00103e21;
    pUVar6->tail = pUVar1;
    pUVar6->num_buckets = 0x20;
    pUVar6->log2_num_buckets = 5;
    pUVar6->hho = 0x28;
    __ptr = (UT_hash_bucket *)calloc(1,0x200);
    pUVar6->buckets = __ptr;
    pUVar6->signature = 0xa0111fe1;
    if (__ptr == (UT_hash_bucket *)0x0) goto LAB_00103e21;
    ctx->channels = channel;
    uVar11 = 0x20;
  }
  else {
    pUVar6 = (ctx->channels->hh).tbl;
    (channel->hh).tbl = pUVar6;
    (channel->hh).next = (void *)0x0;
    pUVar13 = pUVar6->tail;
    (channel->hh).prev = (void *)((long)pUVar13 - pUVar6->hho);
    pUVar13->next = channel;
    pUVar6->tail = pUVar1;
    uVar11 = pUVar6->num_buckets;
    __ptr = pUVar6->buckets;
  }
  uVar12 = pUVar6->num_items + 1;
  pUVar6->num_items = uVar12;
  uVar9 = uVar11 - 1 & uVar9;
  uVar14 = __ptr[uVar9].count + 1;
  __ptr[uVar9].count = uVar14;
  pUVar13 = __ptr[uVar9].hh_head;
  (channel->hh).hh_next = pUVar13;
  (channel->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar13 != (UT_hash_handle *)0x0) {
    pUVar13->hh_prev = pUVar1;
  }
  __ptr[uVar9].hh_head = pUVar1;
  if ((__ptr[uVar9].expand_mult * 10 + 10 <= uVar14) && (pUVar6->noexpand == 0)) {
    pUVar7 = (UT_hash_bucket *)calloc(1,(ulong)uVar11 << 5);
    if (pUVar7 == (UT_hash_bucket *)0x0) {
LAB_00103e21:
      exit(-1);
    }
    uVar9 = uVar11 * 2 - 1;
    uVar12 = ((uVar12 >> ((char)pUVar6->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar9 & uVar12) == 0);
    pUVar6->ideal_chain_maxlen = uVar12;
    pUVar6->nonideal_items = 0;
    uVar14 = 0;
    for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
      pUVar13 = __ptr[uVar10].hh_head;
      while (pUVar13 != (UT_hash_handle *)0x0) {
        pUVar3 = pUVar13->hh_next;
        uVar16 = pUVar13->hashv & uVar9;
        pUVar2 = pUVar7 + uVar16;
        uVar15 = pUVar7[uVar16].count + 1;
        pUVar7[uVar16].count = uVar15;
        if (uVar12 < uVar15) {
          uVar14 = uVar14 + 1;
          pUVar6->nonideal_items = uVar14;
          if (pUVar2->expand_mult * uVar12 < uVar15) {
            pUVar2->expand_mult = pUVar2->expand_mult + 1;
          }
        }
        pUVar13->hh_prev = (UT_hash_handle *)0x0;
        pUVar4 = pUVar2->hh_head;
        pUVar13->hh_next = pUVar4;
        if (pUVar4 != (UT_hash_handle *)0x0) {
          pUVar4->hh_prev = pUVar13;
        }
        pUVar2->hh_head = pUVar13;
        pUVar13 = pUVar3;
      }
    }
    free(__ptr);
    pUVar6 = pUVar1->tbl;
    pUVar6->num_buckets = pUVar6->num_buckets << 1;
    pUVar6->log2_num_buckets = pUVar6->log2_num_buckets + 1;
    pUVar6->buckets = pUVar7;
    if (pUVar6->num_items >> 1 < pUVar6->nonideal_items) {
      uVar9 = pUVar6->ineff_expands + 1;
      pUVar6->ineff_expands = uVar9;
      if (1 < uVar9) {
        pUVar6->noexpand = 1;
      }
    }
    else {
      pUVar6->ineff_expands = 0;
    }
  }
  return 0;
}

Assistant:

int chirc_ctx_add_channel(chirc_ctx_t *ctx, chirc_channel_t *channel)
{
    HASH_ADD_KEYPTR(hh, ctx->channels, channel->name, sdslen(channel->name), channel);

    return CHIRC_OK;
}